

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Softmax_x86_avx::forward_inplace(Softmax_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  uint elemcount;
  uint elemcount_00;
  int elempack;
  void *pvVar1;
  size_t sVar2;
  int *piVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  uint elemcount_01;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  float *pfVar13;
  int iVar14;
  int i;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  bool local_e5;
  Mat local_a8;
  ulong local_60;
  Option *local_58;
  ulong local_50;
  int local_44;
  ulong local_40;
  long local_38;
  
  uVar16 = bottom_top_blob->dims;
  local_60 = (ulong)uVar16;
  uVar12 = bottom_top_blob->w;
  uVar17 = (ulong)uVar12;
  elemcount_01 = bottom_top_blob->h;
  elemcount = bottom_top_blob->d;
  elemcount_00 = bottom_top_blob->c;
  uVar7 = (ulong)elemcount_00;
  elempack = bottom_top_blob->elempack;
  iVar10 = (this->super_Softmax).axis;
  iVar10 = (iVar10 >> 0x1f & uVar16) + iVar10;
  uVar9 = uVar17;
  local_58 = opt;
  local_50 = uVar17;
  if (uVar16 == 1) {
    softmax((float *)bottom_top_blob->data,elempack * uVar12,1);
    bVar18 = iVar10 == 0;
  }
  else {
    bVar18 = iVar10 == 0;
    bVar19 = uVar16 == 2;
    if ((bVar19) && (iVar10 == 0)) {
      iVar6 = opt->num_threads;
      iVar15 = (int)(uVar12 + iVar6 + -1) / iVar6;
      local_a8.cstep = 0;
      local_a8.data = (void *)0x0;
      local_a8.refcount._0_4_ = 0;
      local_a8.refcount._4_4_ = 0;
      local_a8.elemsize._0_4_ = 0;
      local_a8.elemsize._4_4_ = 0;
      local_a8.elempack = 0;
      local_a8.allocator = (Allocator *)0x0;
      local_a8.dims = 0;
      local_a8.w = 0;
      local_a8.h = 0;
      local_a8.d = 0;
      local_a8.c = 0;
      Mat::create(&local_a8,iVar15,2,iVar6,4,opt->workspace_allocator);
      if ((local_a8.data == (void *)0x0) || ((long)local_a8.c * local_a8.cstep == 0)) {
        piVar3 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
        if (piVar3 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 != 0) {
          return -100;
        }
        if (local_a8.allocator != (Allocator *)0x0) {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
          return -100;
        }
        goto LAB_00317619;
      }
      uVar8 = 0;
      uVar11 = (long)(int)uVar12 / (long)iVar15 & 0xffffffff;
      if ((int)((long)(int)uVar12 / (long)iVar15) < 1) {
        uVar11 = uVar8;
      }
      while( true ) {
        iVar6 = (int)uVar17;
        bVar18 = uVar11 == 0;
        uVar11 = uVar11 - 1;
        if (bVar18) break;
        iVar5 = get_omp_thread_num();
        iVar14 = iVar6;
        if (iVar15 <= iVar6) {
          iVar14 = iVar15;
        }
        pfVar13 = (float *)((long)iVar5 * local_a8.cstep *
                            CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize) +
                           (long)local_a8.data);
        softmax((float *)((long)bottom_top_blob->data + uVar8),elemcount_01,elempack,
                elempack * uVar12,iVar14,pfVar13,pfVar13 + iVar15);
        uVar8 = uVar8 + (long)elempack * (long)iVar15 * 4;
        uVar17 = (ulong)(uint)(iVar6 - iVar15);
        uVar9 = local_50;
      }
      piVar3 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            free(local_a8.data);
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bVar18 = true;
      bVar19 = true;
    }
    if ((bVar19) && (iVar10 == 1)) {
      uVar17 = 0;
      uVar11 = 0;
      if (0 < (int)elemcount_01) {
        uVar11 = (ulong)elemcount_01;
      }
      for (; uVar11 != uVar17; uVar17 = uVar17 + 1) {
        softmax((float *)((long)bottom_top_blob->w * uVar17 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data),(int)uVar9,elempack);
      }
    }
  }
  local_e5 = iVar10 == 1;
  if (((int)local_60 - 3U < 2) && (bVar18)) {
    iVar15 = elemcount_01 * (int)uVar9 * elemcount;
    iVar6 = local_58->num_threads;
    iVar14 = (iVar15 + iVar6 + -1) / iVar6;
    sVar4 = bottom_top_blob->cstep;
    local_a8.cstep = 0;
    local_a8.data = (void *)0x0;
    local_a8.refcount._0_4_ = 0;
    local_a8.refcount._4_4_ = 0;
    local_a8.elemsize._0_4_ = 0;
    local_a8.elemsize._4_4_ = 0;
    local_a8.elempack = 0;
    local_a8.allocator = (Allocator *)0x0;
    local_a8.dims = 0;
    local_a8.w = 0;
    local_a8.h = 0;
    local_a8.d = 0;
    local_a8.c = 0;
    Mat::create(&local_a8,iVar14,2,iVar6,4,local_58->workspace_allocator);
    if ((local_a8.data == (void *)0x0) || ((long)local_a8.c * local_a8.cstep == 0)) {
      piVar3 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar3 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 != 0) {
        return -100;
      }
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        return -100;
      }
      goto LAB_00317619;
    }
    uVar11 = 0;
    uVar17 = (long)iVar15 / (long)iVar14 & 0xffffffff;
    if ((int)((long)iVar15 / (long)iVar14) < 1) {
      uVar17 = uVar11;
    }
    while (bVar18 = uVar17 != 0, uVar17 = uVar17 - 1, bVar18) {
      iVar5 = get_omp_thread_num();
      iVar6 = iVar15;
      if (iVar14 <= iVar15) {
        iVar6 = iVar14;
      }
      pfVar13 = (float *)((long)iVar5 * local_a8.cstep *
                          CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize) +
                         (long)local_a8.data);
      softmax((float *)((long)bottom_top_blob->data + uVar11),elemcount_00,elempack,
              (int)sVar4 * elempack,iVar6,pfVar13,pfVar13 + iVar14);
      uVar11 = uVar11 + (long)elempack * (long)iVar14 * 4;
      uVar9 = local_50;
      iVar15 = iVar15 - iVar14;
    }
    piVar3 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_a8.allocator == (Allocator *)0x0) {
          free(local_a8.data);
        }
        else {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if ((local_e5 && (int)local_60 == 3) || (iVar10 == 2 && (int)local_60 == 4)) {
    iVar6 = elempack * (int)uVar9;
    local_a8.cstep = 0;
    local_a8.data = (void *)0x0;
    local_a8.refcount._0_4_ = 0;
    local_a8.refcount._4_4_ = 0;
    local_a8.elemsize._0_4_ = 0;
    local_a8.elemsize._4_4_ = 0;
    local_a8.elempack = 0;
    local_a8.allocator = (Allocator *)0x0;
    local_a8.dims = 0;
    local_a8.w = 0;
    local_a8.h = 0;
    local_a8.d = 0;
    local_a8.c = 0;
    Mat::create(&local_a8,iVar6,2,local_58->num_threads,4,local_58->workspace_allocator);
    if ((local_a8.data == (void *)0x0) || ((long)local_a8.c * local_a8.cstep == 0)) {
      piVar3 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar3 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 != 0) {
        return -100;
      }
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        return -100;
      }
      goto LAB_00317619;
    }
    local_38 = (long)iVar6;
    uVar11 = 0;
    uVar17 = 0;
    if (0 < (int)elemcount) {
      uVar17 = (ulong)elemcount;
    }
    local_44 = iVar6;
    local_40 = 0;
    if (0 < (int)elemcount_00) {
      local_40 = uVar7;
    }
    for (; uVar11 != local_40; uVar11 = uVar11 + 1) {
      for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
        iVar6 = bottom_top_blob->w;
        iVar15 = bottom_top_blob->h;
        pvVar1 = bottom_top_blob->data;
        sVar4 = bottom_top_blob->elemsize;
        sVar2 = bottom_top_blob->cstep;
        iVar14 = get_omp_thread_num();
        pfVar13 = (float *)((long)iVar14 * local_a8.cstep *
                            CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize) +
                           (long)local_a8.data);
        softmax((float *)((long)pvVar1 +
                         (long)iVar15 * sVar4 * (long)iVar6 * uVar8 + sVar2 * uVar11 * sVar4),
                elemcount_01,1,local_44,local_44,pfVar13,pfVar13 + local_38);
        uVar9 = local_50;
      }
    }
    piVar3 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_a8.allocator == (Allocator *)0x0) {
          free(local_a8.data);
        }
        else {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  iVar6 = (int)uVar9;
  if (((int)local_60 == 3) && (iVar10 == 2)) {
    uVar17 = 0;
    uVar16 = 0;
    if (0 < (int)elemcount_01) {
      uVar16 = elemcount_01;
    }
    uVar11 = 0;
    if (0 < (int)elemcount_00) {
      uVar11 = uVar7;
    }
    for (; uVar17 != uVar11; uVar17 = uVar17 + 1) {
      pfVar13 = (float *)(bottom_top_blob->cstep * bottom_top_blob->elemsize * uVar17 +
                         (long)bottom_top_blob->data);
      uVar12 = uVar16;
      while (bVar18 = uVar12 != 0, uVar12 = uVar12 - 1, bVar18) {
        softmax(pfVar13,iVar6,elempack);
        pfVar13 = pfVar13 + elempack * iVar6;
      }
    }
  }
  iVar15 = (int)local_60;
  if (iVar15 == 4 && local_e5) {
    iVar15 = elempack * iVar6 * elemcount_01;
    local_a8.cstep = 0;
    local_a8.data = (void *)0x0;
    local_a8.refcount._0_4_ = 0;
    local_a8.refcount._4_4_ = 0;
    local_a8.elemsize._0_4_ = 0;
    local_a8.elemsize._4_4_ = 0;
    local_a8.elempack = 0;
    local_a8.allocator = (Allocator *)0x0;
    local_a8.dims = 0;
    local_a8.w = 0;
    local_a8.h = 0;
    local_a8.d = 0;
    local_a8.c = 0;
    Mat::create(&local_a8,iVar15,2,local_58->num_threads,4,local_58->workspace_allocator);
    if ((local_a8.data == (void *)0x0) || ((long)local_a8.c * local_a8.cstep == 0)) {
      piVar3 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar3 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 != 0) {
        return -100;
      }
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        return -100;
      }
LAB_00317619:
      free(local_a8.data);
      return -100;
    }
    uVar11 = 0;
    uVar17 = 0;
    if (0 < (int)elemcount_00) {
      uVar17 = uVar7;
    }
    for (; iVar6 = (int)uVar9, uVar17 != uVar11; uVar11 = uVar11 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar2 = bottom_top_blob->cstep;
      iVar6 = get_omp_thread_num();
      pfVar13 = (float *)((long)iVar6 * local_a8.cstep *
                          CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize) +
                         (long)local_a8.data);
      softmax((float *)((long)pvVar1 + sVar2 * uVar11 * sVar4),elemcount,1,iVar15,iVar15,pfVar13,
              pfVar13 + iVar15);
      uVar9 = local_50;
    }
    piVar3 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_a8.allocator == (Allocator *)0x0) {
          free(local_a8.data);
        }
        else {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar15 = (int)local_60;
  }
  if (iVar15 != 4) {
    return 0;
  }
  if (iVar10 == 3) {
    if ((int)elemcount_01 < 1) {
      elemcount_01 = 0;
    }
    if ((int)elemcount < 1) {
      elemcount = 0;
    }
    if ((int)elemcount_00 < 1) {
      uVar7 = 0;
    }
    for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
      pfVar13 = (float *)(bottom_top_blob->cstep * uVar9 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      for (uVar16 = 0; uVar12 = elemcount_01, uVar16 != elemcount; uVar16 = uVar16 + 1) {
        while (bVar18 = uVar12 != 0, uVar12 = uVar12 - 1, bVar18) {
          softmax(pfVar13,iVar6,elempack);
          pfVar13 = pfVar13 + elempack * iVar6;
        }
      }
    }
    return 0;
  }
  return 0;
}

Assistant:

int Softmax_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int d = bottom_top_blob.d;
    const int channels = bottom_top_blob.c;
    const int elempack = bottom_top_blob.elempack;
    const int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        float* ptr = bottom_top_blob;

        const int size = w * elempack;

        softmax(ptr, size, 1);
    }

    if (dims == 2 && positive_axis == 0)
    {
        const int size = w;
        const int sizen = (size + (opt.num_threads - 1)) / opt.num_threads;
        const int stride = w * elempack;

        Mat maxsum(sizen, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        const int nn_size = size / sizen;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            const int i = ii * sizen;
            const int size1 = std::min(sizen, size - i);

            float* maxsumptr = maxsum.channel(get_omp_thread_num());
            float* maxptr = maxsumptr;
            float* sumptr = maxptr + sizen;

            float* ptr = (float*)bottom_top_blob + i * elempack;

            softmax(ptr, h, elempack, stride, size1, maxptr, sumptr);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            softmax(ptr, w, elempack);
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        const int size = w * h * d;
        const int sizen = (size + (opt.num_threads - 1)) / opt.num_threads;
        const int stride = bottom_top_blob.cstep * elempack;

        Mat maxsum(sizen, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        const int nn_size = size / sizen;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            const int i = ii * sizen;
            const int size1 = std::min(sizen, size - i);

            float* maxsumptr = maxsum.channel(get_omp_thread_num());
            float* maxptr = maxsumptr;
            float* sumptr = maxptr + sizen;

            float* ptr = (float*)bottom_top_blob + i * elempack;

            softmax(ptr, channels, elempack, stride, size1, maxptr, sumptr);
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        const int size = w * elempack;

        Mat maxsum(size, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            for (int i = 0; i < d; i++)
            {
                float* ptr = bottom_top_blob.channel(q).depth(i);

                float* maxsumptr = maxsum.channel(get_omp_thread_num());
                float* maxptr = maxsumptr;
                float* sumptr = maxptr + size;

                softmax(ptr, h, 1, size, size, maxptr, sumptr);
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                softmax(ptr, w, elempack);
                ptr += w * elempack;
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        const int size = w * h * elempack;

        Mat maxsum(size, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float* maxsumptr = maxsum.channel(get_omp_thread_num());
            float* maxptr = maxsumptr;
            float* sumptr = maxptr + size;

            softmax(ptr, d, 1, size, size, maxptr, sumptr);
        }
    }

    if (dims == 4 && positive_axis == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    softmax(ptr, w, elempack);
                    ptr += w * elempack;
                }
            }
        }
    }

    return 0;
}